

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall cmNinjaTargetGenerator::ForceResponseFile(cmNinjaTargetGenerator *this)

{
  bool bVar1;
  int iVar2;
  
  if (ForceResponseFile()::forceRspFile_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ForceResponseFile()::forceRspFile_abi_cxx11_);
    if (iVar2 != 0) {
      ForceResponseFile()::forceRspFile_abi_cxx11_._M_dataplus._M_p =
           (pointer)&ForceResponseFile()::forceRspFile_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ForceResponseFile()::forceRspFile_abi_cxx11_,
                 "CMAKE_NINJA_FORCE_RESPONSE_FILE","");
      __cxa_atexit(std::__cxx11::string::~string,&ForceResponseFile()::forceRspFile_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ForceResponseFile()::forceRspFile_abi_cxx11_);
    }
  }
  bVar1 = cmMakefile::IsDefinitionSet
                    ((this->super_cmCommonTargetGenerator).Makefile,
                     &ForceResponseFile()::forceRspFile_abi_cxx11_);
  if (bVar1) {
    return true;
  }
  bVar1 = cmsys::SystemTools::HasEnv(&ForceResponseFile()::forceRspFile_abi_cxx11_);
  return bVar1;
}

Assistant:

bool cmNinjaTargetGenerator::ForceResponseFile()
{
  static std::string const forceRspFile = "CMAKE_NINJA_FORCE_RESPONSE_FILE";
  return (this->GetMakefile()->IsDefinitionSet(forceRspFile) ||
          cmSystemTools::HasEnv(forceRspFile));
}